

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O2

void destroy_drawbridge(int x,int y)

{
  undefined1 *puVar1;
  char cVar2;
  schar sVar3;
  schar sVar4;
  level *plVar5;
  int x_00;
  boolean bVar6;
  uint uVar7;
  long lVar8;
  obj *obj;
  trap *ptVar9;
  long lVar10;
  byte bVar11;
  char *line;
  int iVar12;
  int y2;
  int x2;
  
  plVar5 = level;
  cVar2 = level->locations[x][y].typ;
  if ((cVar2 != '$') && (cVar2 != '\x14')) {
    return;
  }
  y2 = y;
  x2 = x;
  get_wall_for_db(&x2,&y2);
  x_00 = x2;
  iVar12 = y2;
  lVar8 = (long)x2;
  lVar10 = (long)y2;
  uVar7 = *(uint *)&plVar5->locations[x][y].field_0x6 >> 4 & 0x1c;
  if (uVar7 == 0x10) {
LAB_0015cf0a:
    uVar7 = 2 - (uVar7 == 0);
LAB_0015cf1a:
    if (cVar2 == '\x14') {
      if ((viz_array[lVar10][lVar8] & 2U) == 0) {
joined_r0x0015cf80:
        if (flags.soundok != '\0') {
          You_hear("a loud *SPLASH*!");
        }
      }
      else {
        pline("The portcullis of the drawbridge falls into the %s!",destroy_drawbridge::wstr[uVar7])
        ;
      }
    }
    else {
      if ((viz_array[y][x] & 2U) == 0) goto joined_r0x0015cf80;
      pline("The drawbridge collapses into the %s!",destroy_drawbridge::wstr[uVar7]);
    }
    sVar3 = '#';
    if (uVar7 == 1) {
      sVar3 = '\x12';
    }
    sVar4 = '\x15';
    if (uVar7 != 0) {
      sVar4 = sVar3;
    }
    plVar5->locations[x][y].typ = sVar4;
    puVar1 = &plVar5->locations[x][y].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
    obj = sobj_at(0x214,level,x,y);
    if (obj != (obj *)0x0) {
      obj_extract_self(obj);
      flooreffects(obj,x,y,"fall");
    }
  }
  else {
    if (uVar7 == 4) {
      uVar7 = 0;
      goto LAB_0015cf1a;
    }
    if (uVar7 == 0) goto LAB_0015cf0a;
    if ((viz_array[y][x] & 2U) == 0) {
      You_hear("a loud *CRASH*!");
    }
    else {
      pline("The drawbridge disintegrates!");
    }
    uVar7 = *(uint *)&plVar5->locations[x][y].field_0x6;
    plVar5->locations[x][y].typ = ((char)uVar7 < '\0') * '\t' + '\x19';
    *(uint *)&plVar5->locations[x][y].field_0x6 = (uVar7 & 0xfffffe0f) + (uVar7 & 0x80) * 2;
  }
  wake_nearto(x,y,500);
  plVar5->locations[lVar8][lVar10].typ = '\x17';
  puVar1 = &plVar5->locations[lVar8][lVar10].field_0x6;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
  ptVar9 = t_at(level,x,y);
  if (ptVar9 != (trap *)0x0) {
    deltrap(level,ptVar9);
  }
  ptVar9 = t_at(level,x_00,iVar12);
  if (ptVar9 != (trap *)0x0) {
    deltrap(level,ptVar9);
  }
  newsym(x,y);
  newsym(x_00,iVar12);
  bVar6 = does_block(level,x_00,iVar12,(monst *)0x0);
  if (bVar6 == '\0') {
    unblock_point(x_00,iVar12);
  }
  bVar6 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
  if (bVar6 != '\0') {
    u.uevent._1_1_ = u.uevent._1_1_ | 1;
  }
  set_entity(x_00,iVar12,occupants + 1);
  if (occupants[1].edata != (permonst *)0x0) {
    if (occupants[1].emon == &youmonst) {
      bVar11 = 0;
    }
    else {
      if ((occupants[1].emon)->wormno == '\0') {
        if ((viz_array[(occupants[1].emon)->my][(occupants[1].emon)->mx] & 2U) != 0)
        goto LAB_0015d25a;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0015d1ee;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0015d1e9;
        }
        else {
LAB_0015d1e9:
          if (ublindf == (obj *)0x0) goto LAB_0015d1fb;
LAB_0015d1ee:
          bVar11 = 1;
          if (ublindf->oartifact != '\x1d') goto LAB_0015d2b0;
        }
        if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (bVar11 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
            (bVar11 = 1, (viz_array[(occupants[1].emon)->my][(occupants[1].emon)->mx] & 1U) == 0))
           || (((occupants[1].emon)->data->mflags3 & 0x200) == 0)) goto LAB_0015d2b0;
      }
      else {
        bVar6 = worm_known(level,occupants[1].emon);
        if (bVar6 == '\0') {
LAB_0015d1fb:
          bVar11 = 1;
          goto LAB_0015d2b0;
        }
      }
LAB_0015d25a:
      uVar7 = *(uint *)&(occupants[1].emon)->field_0x60;
      if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        bVar11 = 1;
        if (-1 < (char)uVar7) goto LAB_0015d29a;
      }
      else {
        bVar11 = 1;
        if ((-1 < (char)uVar7) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0015d29a:
          bVar11 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar7 >> 9) & 1;
        }
      }
    }
LAB_0015d2b0:
    bVar6 = automiss(occupants + 1);
    if (bVar6 == '\0') {
      if (bVar11 == 0) {
        iVar12 = 3;
        E_phrase(occupants + 1,"are");
        pline("%s blown apart by flying debris.",E_phrase::wholebuf);
      }
      else {
        iVar12 = 2;
      }
      killer_format = 0;
      killer = "exploding drawbridge";
      e_died(occupants + 1,iVar12,7);
    }
  }
  set_entity(x,y,occupants);
  if (occupants[0].edata == (permonst *)0x0) {
    return;
  }
  if (occupants[0].emon == &youmonst) {
    bVar11 = 0;
    goto LAB_0015d47d;
  }
  if ((occupants[0].emon)->wormno == '\0') {
    if ((viz_array[(occupants[0].emon)->my][(occupants[0].emon)->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0015d3bb;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0015d3b6;
      }
      else {
LAB_0015d3b6:
        if (ublindf == (obj *)0x0) goto LAB_0015d3c8;
LAB_0015d3bb:
        bVar11 = 1;
        if (ublindf->oartifact != '\x1d') goto LAB_0015d47d;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (bVar11 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
          (bVar11 = 1, (viz_array[(occupants[0].emon)->my][(occupants[0].emon)->mx] & 1U) == 0)) ||
         (((occupants[0].emon)->data->mflags3 & 0x200) == 0)) goto LAB_0015d47d;
    }
  }
  else {
    bVar6 = worm_known(level,occupants[0].emon);
    if (bVar6 == '\0') {
LAB_0015d3c8:
      bVar11 = 1;
      goto LAB_0015d47d;
    }
  }
  uVar7 = *(uint *)&(occupants[0].emon)->field_0x60;
  if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    bVar11 = 1;
    if ((char)uVar7 < '\0') goto LAB_0015d47d;
  }
  else {
    bVar11 = 1;
    if (((char)uVar7 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_0015d47d;
  }
  bVar11 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar7 >> 9) & 1;
LAB_0015d47d:
  bVar6 = e_missed(occupants,'\x01');
  if (bVar6 == '\0') {
    if (bVar11 == 0) {
      if ((((occupants[0].emon == &youmonst) || (u.uprops[0x23].intrinsic == 0)) ||
          (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar6 = dmgtype(youmonst.data,0x24), bVar6 != '\0')))) {
        E_phrase(occupants,"are");
        line = "%s hit by a huge chunk of metal!";
      }
      else {
        E_phrase(occupants,"get");
        line = "%s into some heavy metal!";
      }
      pline(line,E_phrase::wholebuf);
      iVar12 = 3;
    }
    else {
      iVar12 = 2;
      if (((flags.soundok != '\0') && (occupants[0].emon != &youmonst)) &&
         (bVar6 = is_pool(level,x,y), bVar6 == '\0')) {
        You_hear("a crushing sound.");
      }
    }
    killer_format = 0;
    killer = "collapsing drawbridge";
    e_died(occupants,iVar12,7);
    if (plVar5->locations[x][y].typ == '\x12') {
      do_entity(occupants);
      return;
    }
  }
  return;
}

Assistant:

void destroy_drawbridge(int x, int y)
{
	struct rm *loc1, *loc2;
	struct trap *t;
	int x2, y2;
	int db_u;
	boolean e_inview;
	struct entity *etmp1 = &(occupants[0]), *etmp2 = &(occupants[1]);

	loc1 = &level->locations[x][y];
	if (!IS_DRAWBRIDGE(loc1->typ))
		return;
	x2 = x; y2 = y;
	get_wall_for_db(&x2,&y2);
	loc2 = &level->locations[x2][y2];
	db_u = (loc1->drawbridgemask & DB_UNDER);
	if (db_u == DB_MOAT || db_u == DB_LAVA || db_u == DB_BOG) {
		struct obj *otmp;
		int where = (db_u == DB_LAVA) ? 0 :
			    (db_u == DB_MOAT) ? 1 : 2;
		static char *wstr[3] = { "lava", "moat", "swamp" };
		if (loc1->typ == DRAWBRIDGE_UP) {
			if (cansee(x2,y2))
			    pline("The portcullis of the drawbridge falls into the %s!",
				  wstr[where]);
			else if (flags.soundok)
				You_hear("a loud *SPLASH*!");
		} else {
			if (cansee(x,y))
			    pline("The drawbridge collapses into the %s!",
				  wstr[where]);
			else if (flags.soundok)
				You_hear("a loud *SPLASH*!");
		}
		loc1->typ = (where == 0) ? LAVAPOOL :
			    (where == 1) ? MOAT : BOG;
		loc1->drawbridgemask = 0;
		if ((otmp = sobj_at(BOULDER, level, x,y)) != 0) {
		    obj_extract_self(otmp);
		    flooreffects(otmp,x,y,"fall");
		}
	} else {
		if (cansee(x,y))
			pline("The drawbridge disintegrates!");
		else
			You_hear("a loud *CRASH*!");
		loc1->typ =
			((loc1->drawbridgemask & DB_ICE) ? ICE : ROOM);
		loc1->icedpool =
			((loc1->drawbridgemask & DB_ICE) ? ICED_MOAT : 0);
	}
	wake_nearto(x, y, 500);
	loc2->typ = DOOR;
	loc2->doormask = D_NODOOR;
	if ((t = t_at(level, x, y)) != 0) deltrap(level, t);
	if ((t = t_at(level, x2, y2)) != 0) deltrap(level, t);
	newsym(x,y);
	newsym(x2,y2);
	if (!does_block(level, x2, y2, NULL)) unblock_point(x2,y2); /* vision */
	if (Is_stronghold(&u.uz)) u.uevent.uopened_dbridge = TRUE;

	set_entity(x2, y2, etmp2); /* currently only automissers can be here */
	if (etmp2->edata) {
		e_inview = e_canseemon(level, etmp2);
		if (!automiss(etmp2)) {
			if (e_inview)
				pline("%s blown apart by flying debris.",
				      E_phrase(etmp2, "are"));
			killer_format = KILLED_BY_AN;
			killer = "exploding drawbridge";
			e_died(etmp2, e_inview? 3 : 2, CRUSHING); /*no corpse*/
		}	     /* nothing which is vulnerable can survive this */
	}
	set_entity(x, y, etmp1);
	if (etmp1->edata) {
		e_inview = e_canseemon(level, etmp1);
		if (!e_missed(etmp1, TRUE)) {
			if (e_inview) {
			    if (!is_u(etmp1) && Hallucination)
				pline("%s into some heavy metal!",
				      E_phrase(etmp1, "get"));
			    else
				pline("%s hit by a huge chunk of metal!",
				      E_phrase(etmp1, "are"));
			} else {
			    if (flags.soundok && !is_u(etmp1) && !is_pool(level, x,y))
				You_hear("a crushing sound.");
			}
			killer_format = KILLED_BY_AN;
			killer = "collapsing drawbridge";
			e_died(etmp1, e_inview? 3 : 2, CRUSHING); /*no corpse*/
			if (loc1->typ == MOAT) do_entity(etmp1);
		}
	}
}